

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  _Bool _Var7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  iVar2 = it->container_index;
  if (iVar2 < 0) {
LAB_0011afc6:
    it->has_value = false;
    _Var7 = false;
  }
  else {
    iVar3 = (it->parent->high_low_container).size;
    if (iVar2 < iVar3) {
      uVar1 = it->typecode;
      if (uVar1 == '\x03') {
        if (it->current_value == 0) goto LAB_0011afc6;
        uVar9 = it->current_value - 1;
        it->current_value = uVar9;
        lVar5 = *(long *)((long)it->container + 8);
        iVar3 = it->run_index;
        if (((uint)*(ushort *)(lVar5 + (long)iVar3 * 4) | it->highbits) <= uVar9) goto LAB_0011affe;
        uVar9 = iVar3 - 1;
        it->run_index = uVar9;
        if (0 < iVar3) {
          uVar9 = (uint)*(ushort *)(lVar5 + 2 + (ulong)uVar9 * 4) +
                  (uint)*(ushort *)(lVar5 + (ulong)uVar9 * 4) | it->highbits;
          goto LAB_0011afc1;
        }
      }
      else if (uVar1 == '\x02') {
        iVar3 = it->in_container_index;
        uVar9 = iVar3 - 1;
        it->in_container_index = uVar9;
        if (0 < iVar3) {
          uVar9 = (uint)*(ushort *)(*(long *)((long)it->container + 8) + (ulong)uVar9 * 2) |
                  it->highbits;
LAB_0011afc1:
          it->current_value = uVar9;
LAB_0011affe:
          it->has_value = true;
          return true;
        }
      }
      else {
        if (uVar1 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x4164,
                        "_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *)");
        }
        uVar4 = it->in_container_index;
        uVar9 = uVar4 - 1;
        it->in_container_index = uVar9;
        if (0 < (int)uVar4) {
          uVar8 = uVar9 >> 6;
          lVar5 = *(long *)((long)it->container + 8);
          uVar10 = (ulong)(*(long *)(lVar5 + (ulong)uVar8 * 8) << (~(byte)uVar9 & 0x3f)) >>
                   (~(byte)uVar9 & 0x3f);
          bVar13 = uVar10 == 0;
          if ((bVar13) && (uVar8 = 0xffffffff, 0x40 < uVar4)) {
            uVar12 = (ulong)(uVar9 >> 6);
            do {
              uVar11 = uVar12 - 1;
              uVar10 = *(ulong *)(lVar5 + uVar11 * 8);
              bVar13 = uVar10 == 0;
              if (!bVar13) {
                uVar8 = (uint)uVar11;
                break;
              }
              bVar6 = 1 < (long)uVar12;
              uVar12 = uVar11;
            } while (bVar6);
          }
          if (!bVar13) {
            lVar5 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
              }
            }
            uVar9 = (uVar8 << 6 | (uint)lVar5 ^ 0x3f) ^ 0x3f;
            it->in_container_index = uVar9;
            it->current_value = uVar9 | it->highbits;
            goto LAB_0011affe;
          }
        }
      }
      it->container_index = iVar2 + -1;
    }
    else {
      it->container_index = iVar3 + -1;
    }
    _Var7 = loadlastvalue(it);
    it->has_value = _Var7;
  }
  return _Var7;
}

Assistant:

bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const bitset_container_t* bitset_container = (const bitset_container_t*)it->container;
            int32_t wordindex = it->in_container_index / 64;
            uint64_t word = bitset_container->words[wordindex] & (UINT64_MAX >> (63 - (it->in_container_index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bitset_container->words[wordindex];
            }
            if (word == 0)
                break;

            int num_leading_zeros = __builtin_clzll(word);
            it->in_container_index = (wordindex * 64) + (63 - num_leading_zeros);
            it->current_value = it->highbits | it->in_container_index;
            return (it->has_value = true);
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const array_container_t* array_container = (const array_container_t*)it->container;
            it->current_value = it->highbits | array_container->array[it->in_container_index];
            return (it->has_value = true);
        }
        case RUN_CONTAINER_TYPE: {
            if(it->current_value == 0)
                return (it->has_value = false);

            const run_container_t* run_container = (const run_container_t*)it->container;
            if (--it->current_value >= (it->highbits | run_container->runs[it->run_index].value)) {
                return (it->has_value = true);
            }

            if (--it->run_index < 0)
                break;

            it->current_value = it->highbits | (run_container->runs[it->run_index].value +
                                                run_container->runs[it->run_index].length);
            return (it->has_value = true);
        }
        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)

    // moving to previous container
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}